

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

index_type *
booster::locale::boundary::details::
mapping_traits<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::random_access_iterator_tag>
::map(index_type *__return_storage_ptr__,boundary_type t,
     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     b,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       e,locale *l)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  boundary_indexing<char> *pbVar4;
  char_type *begin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  pointer local_68;
  pointer pbStack_60;
  pointer local_58 [2];
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (b._M_current == e._M_current) {
    local_68 = (pointer)local_58;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_68,b._M_current,e._M_current);
    pbVar4 = std::use_facet<booster::locale::boundary::boundary_indexing<char>>(l);
    (**(code **)(*(long *)pbVar4 + 0x10))(&local_48,pbVar4,t,local_68,pbStack_60 + (long)local_68);
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (__return_storage_ptr__->
             super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (__return_storage_ptr__->
             super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_start = local_48;
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbStack_40;
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
    local_48 = pbVar1;
    pbStack_40 = pbVar2;
    local_38 = pbVar3;
    if (pbVar1 != (pointer)0x0) {
      operator_delete(pbVar1);
    }
    if (local_68 == (pointer)local_58) {
      return __return_storage_ptr__;
    }
  }
  else {
    pbVar4 = std::use_facet<booster::locale::boundary::boundary_indexing<char>>(l);
    (**(code **)(*(long *)pbVar4 + 0x10))(&local_68,pbVar4,t,b._M_current,e._M_current);
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (__return_storage_ptr__->
             super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (__return_storage_ptr__->
             super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_start = local_68;
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbStack_60;
    (__return_storage_ptr__->
    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = local_58[0];
    local_68 = pbVar1;
    pbStack_60 = pbVar2;
    local_58[0] = pbVar3;
    if (pbVar1 == (pointer)0x0) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_68);
  return __return_storage_ptr__;
}

Assistant:

static index_type map(boundary_type t,IteratorType b,IteratorType e,std::locale const &l)
                    {
                        index_type result;

                        //
                        // Optimize for most common cases
                        //
                        // C++0x requires that string is continious in memory and all known
                        // string implementations
                        // do this because of c_str() support. 
                        //

                        if(linear_iterator_traits<char_type,IteratorType>::is_linear && b!=e)
                        {
                            char_type const *begin = &*b;
                            char_type const *end = begin + (e-b);
                            index_type tmp=std::use_facet<boundary_indexing<char_type> >(l).map(t,begin,end);
                            result.swap(tmp);
                        }
                        else {
                            std::basic_string<char_type> str(b,e);
                            index_type tmp = std::use_facet<boundary_indexing<char_type> >(l).map(t,str.c_str(),str.c_str()+str.size());
                            result.swap(tmp);
                        }
                        return result;
                    }